

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_describe_security_ips(void)

{
  code *pcVar1;
  char *__s;
  OcsDescribeSecurityIpsRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a9;
  int ret;
  HttpTestListener *local_188;
  HttpTestListener *listener;
  string local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [55];
  allocator<char> local_f1;
  string local_f0 [32];
  OcsDescribeSecurityIpsRequestType *local_d0;
  Ocs *ocs;
  OcsDescribeSecurityIpsResponseType resp;
  OcsDescribeSecurityIpsRequestType req;
  
  aliyun::OcsDescribeSecurityIpsRequestType::OcsDescribeSecurityIpsRequestType
            ((OcsDescribeSecurityIpsRequestType *)((long)&resp.security_ips.field_2 + 8));
  aliyun::OcsDescribeSecurityIpsResponseType::OcsDescribeSecurityIpsResponseType
            ((OcsDescribeSecurityIpsResponseType *)&ocs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"cn-hangzhou",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_appid",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_secret",&local_151);
  pOVar2 = (OcsDescribeSecurityIpsRequestType *)
           aliyun::Ocs::CreateOcsClient(local_f0,local_128,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pOVar2;
  if (pOVar2 == (OcsDescribeSecurityIpsRequestType *)0x0) {
    aliyun::OcsDescribeSecurityIpsResponseType::~OcsDescribeSecurityIpsResponseType
              ((OcsDescribeSecurityIpsResponseType *)&ocs);
    aliyun::OcsDescribeSecurityIpsRequestType::~OcsDescribeSecurityIpsRequestType
              ((OcsDescribeSecurityIpsRequestType *)((long)&resp.security_ips.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_d0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_security_ips_response;
  local_188 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a9);
  HttpTestListener::Start(local_188);
  std::__cxx11::string::operator=((string *)(resp.security_ips.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  aliyun::Ocs::DescribeSecurityIps
            (local_d0,(OcsDescribeSecurityIpsResponseType *)((long)&resp.security_ips.field_2 + 8),
             (OcsErrorInfo *)&ocs);
  HttpTestListener::WaitComplete(local_188);
  pHVar3 = local_188;
  if (local_188 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_188);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_d0;
  if (local_d0 != (OcsDescribeSecurityIpsRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_d0);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_security_ips() {
  OcsDescribeSecurityIpsRequestType req;
  OcsDescribeSecurityIpsResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_security_ips_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  int ret = ocs->DescribeSecurityIps(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}